

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O3

Sexp * __thiscall GcHeap::GcHeapImpl::Copy(GcHeapImpl *this,Sexp *from_ref)

{
  pointer *pppSVar1;
  Sexp *pSVar2;
  iterator __position;
  Sexp *pSVar3;
  uint64_t uVar4;
  Kind KVar5;
  undefined4 uVar6;
  mapped_type *ppSVar7;
  Sexp *local_30;
  Sexp *from_ref_local;
  Sexp *to_ref;
  
  pSVar2 = (Sexp *)this->free;
  this->free = (uint8_t *)(pSVar2 + 1);
  local_30 = from_ref;
  from_ref_local = pSVar2;
  DebugLog("[%d] relocating: %p -> %p",this->gc_number,from_ref,pSVar2);
  if (from_ref->padding != 0xabababababababab) {
    KVar5 = from_ref->kind;
    uVar6 = *(undefined4 *)&from_ref->field_0x4;
    pSVar3 = (from_ref->field_1).cons.car;
    uVar4 = from_ref->padding;
    (pSVar2->field_1).cons.cdr = (from_ref->field_1).cons.cdr;
    pSVar2->padding = uVar4;
    pSVar2->kind = KVar5;
    *(undefined4 *)&pSVar2->field_0x4 = uVar6;
    (pSVar2->field_1).cons.car = pSVar3;
    *(undefined8 *)from_ref = 0xabababababababab;
    (from_ref->field_1).cons.car = (Sexp *)0xabababababababab;
    (from_ref->field_1).cons.cdr = (Sexp *)0xabababababababab;
    from_ref->padding = 0xabababababababab;
    ppSVar7 = std::__detail::
              _Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->forwarding_addresses,&local_30);
    *ppSVar7 = pSVar2;
    __position._M_current =
         (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Sexp*,std::allocator<Sexp*>>::_M_realloc_insert<Sexp*const&>
                ((vector<Sexp*,std::allocator<Sexp*>> *)&this->worklist,__position,&from_ref_local);
    }
    else {
      *__position._M_current = pSVar2;
      pppSVar1 = &(this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
      from_ref_local = pSVar2;
    }
    return from_ref_local;
  }
  __assert_fail("from_ref->padding != 0xabababababababab && \"relocating an invalid object\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x156,"Sexp *GcHeap::GcHeapImpl::Copy(Sexp *)");
}

Assistant:

Sexp *Copy(Sexp *from_ref) {
    Sexp *to_ref = (Sexp *)free;
    free += sizeof(Sexp);
    // this copy is guaranteed not to overlap since it
    // doesn't cross the fromspace/tospace boundary.
    DebugLog("[%d] relocating: %p -> %p", gc_number, from_ref, to_ref);
#ifdef DEBUG
    assert(from_ref->padding != 0xabababababababab &&
           "relocating an invalid object");
#endif
    memcpy(to_ref, from_ref, sizeof(Sexp));

#ifdef DEBUG
    // use a distinct bit pattern to ensure that
    // we insta-crash on a GC hole.
    memset(from_ref, 0xAB, sizeof(Sexp));
#endif

    forwarding_addresses[from_ref] = to_ref;
    worklist.push_back(to_ref);
    return to_ref;
  }